

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

StorageType_conflict __thiscall
tcu::Float<unsigned_short,_5,_10,_15,_3U>::mantissa(Float<unsigned_short,_5,_10,_15,_3U> *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar2 = this->m_value;
  if ((uVar2 & 0x7fff) != 0) {
    uVar1 = (uVar2 & 0x3ff) + 0x400;
    uVar3 = uVar2 & 0x3ff;
    if ((uVar2 & 0x3ff) == 0) {
      uVar3 = uVar1;
    }
    if ((uVar2 & 0x7c00) != 0) {
      uVar3 = uVar1;
    }
    return uVar3;
  }
  return 0;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}